

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  int iVar1;
  int iVar2;
  RtreeSearchPoint *pRVar3;
  RtreeSearchPoint *pParent;
  RtreeSearchPoint *pRStack_38;
  int nNew;
  RtreeSearchPoint *pNew;
  int local_28;
  int j;
  int i;
  u8 iLevel_local;
  RtreeDValue rScore_local;
  RtreeCursor *pCur_local;
  
  if (pCur->nPointAlloc <= pCur->nPoint) {
    iVar1 = pCur->nPointAlloc * 2 + 8;
    pRVar3 = (RtreeSearchPoint *)sqlite3_realloc64(pCur->aPoint,(long)iVar1 * 0x18);
    if (pRVar3 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    pCur->aPoint = pRVar3;
    pCur->nPointAlloc = iVar1;
  }
  local_28 = pCur->nPoint;
  pCur->nPoint = local_28 + 1;
  pRStack_38 = pCur->aPoint + local_28;
  pRStack_38->rScore = rScore;
  pRStack_38->iLevel = iLevel;
  while( true ) {
    if (local_28 < 1) {
      return pRStack_38;
    }
    iVar1 = (local_28 + -1) / 2;
    pRVar3 = pCur->aPoint;
    iVar2 = rtreeSearchPointCompare(pRStack_38,pRVar3 + iVar1);
    if (-1 < iVar2) break;
    rtreeSearchPointSwap(pCur,iVar1,local_28);
    pRStack_38 = pRVar3 + iVar1;
    local_28 = iVar1;
  }
  return pRStack_38;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc64(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}